

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tracer.h
# Opt level: O0

void __thiscall dynamicgraph::Tracer::~Tracer(Tracer *this)

{
  Tracer *this_local;
  
  *(code **)this = std::__cxx11::string::empty;
  (**(code **)(*(long *)this + 0x48))();
  SignalTimeDependent<int,_int>::~SignalTimeDependent
            ((SignalTimeDependent<int,_int> *)(this + 0x1c8));
  std::__cxx11::
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~list((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)(this + 0x1a8));
  std::__cxx11::
  list<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
  ::~list((list<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
           *)(this + 400));
  std::__cxx11::string::~string((string *)(this + 0x168));
  std::__cxx11::string::~string((string *)(this + 0x148));
  std::__cxx11::string::~string((string *)(this + 0x128));
  std::__cxx11::
  list<const_dynamicgraph::SignalBase<int>_*,_std::allocator<const_dynamicgraph::SignalBase<int>_*>_>
  ::~list((list<const_dynamicgraph::SignalBase<int>_*,_std::allocator<const_dynamicgraph::SignalBase<int>_*>_>
           *)(this + 0xd8));
  dynamicgraph::Entity::~Entity((Entity *)this);
  return;
}

Assistant:

virtual ~Tracer() { closeFiles(); }